

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

nng_err nni_http_server_init(nni_http_server **serverp,nng_url *url)

{
  int iVar1;
  nni_http_server *local_30;
  nni_http_server *s;
  nng_url *pnStack_20;
  nng_err rv;
  nng_url *url_local;
  nni_http_server **serverp_local;
  
  pnStack_20 = url;
  url_local = (nng_url *)serverp;
  nni_mtx_lock(&http_servers_lk);
  local_30 = (nni_http_server *)nni_list_first(&http_servers);
  while( true ) {
    if (local_30 == (nni_http_server *)0x0) {
      s._4_4_ = http_server_init(&local_30,pnStack_20);
      if (s._4_4_ == NNG_OK) {
        nni_list_append(&http_servers,local_30);
        url_local->u_scheme = (char *)local_30;
      }
      nni_mtx_unlock(&http_servers_lk);
      return s._4_4_;
    }
    nni_mtx_lock(&local_30->mtx);
    if ((((local_30->closed & 1U) == 0) && (pnStack_20->u_port == local_30->port)) &&
       (iVar1 = strcmp(pnStack_20->u_hostname,local_30->hostname), iVar1 == 0)) break;
    nni_mtx_unlock(&local_30->mtx);
    local_30 = (nni_http_server *)nni_list_next(&http_servers,local_30);
  }
  url_local->u_scheme = (char *)local_30;
  local_30->refcnt = local_30->refcnt + 1;
  nni_mtx_unlock(&local_30->mtx);
  nni_mtx_unlock(&http_servers_lk);
  return NNG_OK;
}

Assistant:

nng_err
nni_http_server_init(nni_http_server **serverp, const nng_url *url)
{
	nng_err          rv;
	nni_http_server *s;

	nni_mtx_lock(&http_servers_lk);
	NNI_LIST_FOREACH (&http_servers, s) {
		nni_mtx_lock(&s->mtx);
		if ((!s->closed) && (url->u_port == s->port) &&
		    (strcmp(url->u_hostname, s->hostname) == 0)) {
			*serverp = s;
			s->refcnt++;
			nni_mtx_unlock(&s->mtx);
			nni_mtx_unlock(&http_servers_lk);
			return (NNG_OK);
		}
		nni_mtx_unlock(&s->mtx);
	}

	// We didn't find a server, try to make a new one.
	if ((rv = http_server_init(&s, url)) == 0) {
		nni_list_append(&http_servers, s);
		*serverp = s;
	}

	nni_mtx_unlock(&http_servers_lk);
	return (rv);
}